

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenDDLParser.cpp
# Opt level: O1

char * __thiscall ODDLParser::OpenDDLParser::parseHeader(OpenDDLParser *this,char *in,char *end)

{
  byte *pbVar1;
  byte bVar2;
  char *__s;
  pointer ppDVar3;
  bool bVar4;
  _Head_base<0UL,_ODDLParser::Property_*,_false> _Var5;
  _Head_base<0UL,_ODDLParser::Property_*,_false> this_00;
  Text *this_01;
  pointer __p;
  byte *pbVar6;
  size_t sVar7;
  DDLNode *pDVar8;
  pointer __old_p;
  byte *pbVar9;
  unique_ptr<ODDLParser::Property,_std::default_delete<ODDLParser::Property>_> prop;
  unique_ptr<ODDLParser::Property,_std::default_delete<ODDLParser::Property>_> first;
  string type;
  unique_ptr<ODDLParser::Property,_std::default_delete<ODDLParser::Property>_> prev;
  Property *prop_;
  unique_ptr<ODDLParser::Name,_std::default_delete<ODDLParser::Name>_> name;
  Text *id;
  Name *name_;
  _Head_base<0UL,_ODDLParser::Property_*,_false> local_b0;
  _Head_base<0UL,_ODDLParser::Property_*,_false> local_a8;
  string local_a0;
  OpenDDLParser *local_80;
  _Head_base<0UL,_ODDLParser::Property_*,_false> local_78;
  _Head_base<0UL,_ODDLParser::Property_*,_false> local_70;
  unique_ptr<ODDLParser::Name,_std::default_delete<ODDLParser::Name>_> local_68;
  DDLNode *local_60;
  Text *local_58;
  string local_50;
  
  if (in == end || in == (char *)0x0) {
    return in;
  }
  local_58 = (Text *)0x0;
  pbVar6 = (byte *)parseIdentifier(in,end,&local_58);
  this_01 = local_58;
  pbVar9 = pbVar6;
  while (((pbVar6 != (byte *)end && (pbVar9 = pbVar6, (ulong)*pbVar6 < 0x2d)) &&
         ((0x100100002600U >> ((ulong)*pbVar6 & 0x3f) & 1) != 0))) {
    pbVar6 = pbVar6 + 1;
    pbVar9 = (byte *)end;
  }
  if (local_58 == (Text *)0x0) {
    return (char *)pbVar9;
  }
  __s = local_58->m_buffer;
  local_80 = this;
  if (__s == (char *)0x0) {
    pDVar8 = (DDLNode *)0x0;
  }
  else {
    local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
    sVar7 = strlen(__s);
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,__s,__s + sVar7);
    ppDVar3 = (local_80->m_stack).
              super__Vector_base<ODDLParser::DDLNode_*,_std::allocator<ODDLParser::DDLNode_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    if ((local_80->m_stack).
        super__Vector_base<ODDLParser::DDLNode_*,_std::allocator<ODDLParser::DDLNode_*>_>._M_impl.
        super__Vector_impl_data._M_start == ppDVar3) {
      pDVar8 = (DDLNode *)0x0;
    }
    else {
      pDVar8 = ppDVar3[-1];
    }
    local_50._M_string_length = 0;
    local_50.field_2._M_local_buf[0] = '\0';
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    pDVar8 = DDLNode::create(&local_a0,&local_50,pDVar8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,
                      CONCAT71(local_50.field_2._M_allocated_capacity._1_7_,
                               local_50.field_2._M_local_buf[0]) + 1);
    }
    this = local_80;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
      operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
    }
  }
  if (pDVar8 == (DDLNode *)0x0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"nullptr returned by creating DDLNode.",0x25);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '@');
    std::ostream::put('@');
    std::ostream::flush();
  }
  else {
    pushNode(this,pDVar8);
  }
  Text::~Text(this_01);
  operator_delete(this_01,0x18);
  local_50._M_dataplus._M_p = (pointer)0x0;
  pbVar6 = (byte *)parseName((char *)pbVar9,end,(Name **)&local_50);
  local_68._M_t.super___uniq_ptr_impl<ODDLParser::Name,_std::default_delete<ODDLParser::Name>_>._M_t
  .super__Tuple_impl<0UL,_ODDLParser::Name_*,_std::default_delete<ODDLParser::Name>_>.
  super__Head_base<0UL,_ODDLParser::Name_*,_false>._M_head_impl =
       (__uniq_ptr_data<ODDLParser::Name,_std::default_delete<ODDLParser::Name>,_true,_true>)
       (__uniq_ptr_data<ODDLParser::Name,_std::default_delete<ODDLParser::Name>,_true,_true>)
       local_50._M_dataplus._M_p;
  if (local_50._M_dataplus._M_p != (pointer)0x0 && pDVar8 != (DDLNode *)0x0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_a0,*(char **)(*(long *)(local_50._M_dataplus._M_p + 8) + 0x10),
               (allocator<char> *)&local_a8);
    DDLNode::setName(pDVar8,&local_a0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
      operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
    }
  }
  local_a8._M_head_impl = (Property *)0x0;
  pbVar9 = pbVar6;
  while (((pbVar6 != (byte *)end && (pbVar9 = pbVar6, (ulong)*pbVar6 < 0x2d)) &&
         ((0x100100002600U >> ((ulong)*pbVar6 & 0x3f) & 1) != 0))) {
    pbVar6 = pbVar6 + 1;
    pbVar9 = (byte *)end;
  }
  if (*pbVar9 == 0x28) {
    pbVar6 = pbVar9 + 1;
    local_b0._M_head_impl = (Property *)0x0;
    local_78._M_head_impl = (Property *)0x0;
    pbVar1 = pbVar9 + 1;
    bVar4 = pbVar6 == (byte *)end || *pbVar1 == 0x29;
    pbVar9 = pbVar6;
    local_60 = pDVar8;
    if (pbVar6 != (byte *)end && *pbVar1 != 0x29) {
      do {
        local_70._M_head_impl = (Property *)0x0;
        pbVar6 = (byte *)parseProperty((char *)pbVar9,end,&local_70._M_head_impl);
        _Var5._M_head_impl = local_b0._M_head_impl;
        local_b0._M_head_impl = local_70._M_head_impl;
        pbVar9 = pbVar6;
        if (_Var5._M_head_impl != (Property *)0x0) {
          Property::~Property(_Var5._M_head_impl);
          operator_delete(_Var5._M_head_impl,0x20);
        }
        while (((this_00._M_head_impl = local_78._M_head_impl,
                _Var5._M_head_impl = local_b0._M_head_impl, pbVar6 != (byte *)end &&
                (pbVar9 = pbVar6, (ulong)*pbVar6 < 0x2d)) &&
               ((0x100100002600U >> ((ulong)*pbVar6 & 0x3f) & 1) != 0))) {
          pbVar6 = pbVar6 + 1;
          pbVar9 = (byte *)end;
        }
        bVar2 = *pbVar9;
        if ((bVar2 != 0x29) && (bVar2 != 0x2c)) {
          local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,")","");
          logInvalidTokenError((char *)pbVar9,&local_a0,local_80->m_logCallback);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
            operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
          }
          goto LAB_0062b4cf;
        }
        if (bVar2 != 0x2c && local_b0._M_head_impl != (Property *)0x0) {
          if (local_a8._M_head_impl == (Property *)0x0) {
            local_b0._M_head_impl = (Property *)0x0;
            local_a8._M_head_impl = _Var5._M_head_impl;
          }
          _Var5._M_head_impl = local_b0._M_head_impl;
          if (local_78._M_head_impl != (Property *)0x0) {
            local_b0._M_head_impl = (Property *)0x0;
            (local_78._M_head_impl)->m_next = _Var5._M_head_impl;
          }
          local_78._M_head_impl = local_b0._M_head_impl;
          local_b0._M_head_impl = (Property *)0x0;
          if (this_00._M_head_impl != (Property *)0x0) {
            Property::~Property(this_00._M_head_impl);
            operator_delete(this_00._M_head_impl,0x20);
          }
        }
        bVar4 = pbVar9 == (byte *)end || *pbVar9 == 0x29;
      } while (pbVar9 != (byte *)end && *pbVar9 != 0x29);
    }
    pbVar9 = pbVar9 + 1;
LAB_0062b4cf:
    std::unique_ptr<ODDLParser::Property,_std::default_delete<ODDLParser::Property>_>::~unique_ptr
              ((unique_ptr<ODDLParser::Property,_std::default_delete<ODDLParser::Property>_> *)
               &local_78);
    std::unique_ptr<ODDLParser::Property,_std::default_delete<ODDLParser::Property>_>::~unique_ptr
              ((unique_ptr<ODDLParser::Property,_std::default_delete<ODDLParser::Property>_> *)
               &local_b0);
    pDVar8 = local_60;
    if (!bVar4) {
      pbVar9 = (byte *)0x0;
      goto LAB_0062b51c;
    }
  }
  _Var5._M_head_impl = local_a8._M_head_impl;
  if (local_a8._M_head_impl != (Property *)0x0 && pDVar8 != (DDLNode *)0x0) {
    local_a8._M_head_impl = (Property *)0x0;
    DDLNode::setProperties(pDVar8,_Var5._M_head_impl);
  }
LAB_0062b51c:
  std::unique_ptr<ODDLParser::Property,_std::default_delete<ODDLParser::Property>_>::~unique_ptr
            ((unique_ptr<ODDLParser::Property,_std::default_delete<ODDLParser::Property>_> *)
             &local_a8);
  std::unique_ptr<ODDLParser::Name,_std::default_delete<ODDLParser::Name>_>::~unique_ptr(&local_68);
  return (char *)pbVar9;
}

Assistant:

char *OpenDDLParser::parseHeader( char *in, char *end ) {
    if( ddl_nullptr == in || in == end ) {
        return in;
    }

    Text *id( ddl_nullptr );
    in = OpenDDLParser::parseIdentifier( in, end, &id );

#ifdef DEBUG_HEADER_NAME
    dumpId( id );
#endif // DEBUG_HEADER_NAME

    in = lookForNextToken( in, end );
    if( ddl_nullptr != id ) {
        // store the node
        DDLNode *node( createDDLNode( id, this ) );
        if( ddl_nullptr != node ) {
            pushNode( node );
        } else {
            std::cerr << "nullptr returned by creating DDLNode." << std::endl;
        }
        delete id;

		Name *name_(ddl_nullptr);
		in = OpenDDLParser::parseName(in, end, &name_);
		std::unique_ptr<Name> name(name_);
        if( ddl_nullptr != name && ddl_nullptr != node ) {
            const std::string nodeName( name->m_id->m_buffer );
            node->setName( nodeName );
        }


		std::unique_ptr<Property> first;
		in = lookForNextToken(in, end);
		if (*in == Grammar::OpenPropertyToken[0]) {
			in++;
			std::unique_ptr<Property> prop, prev;
			while (*in != Grammar::ClosePropertyToken[0] && in != end) {
				Property *prop_(ddl_nullptr);
				in = OpenDDLParser::parseProperty(in, end, &prop_);
				prop.reset(prop_);
				in = lookForNextToken(in, end);

				if (*in != Grammar::CommaSeparator[0] && *in != Grammar::ClosePropertyToken[0]) {
					logInvalidTokenError(in, Grammar::ClosePropertyToken, m_logCallback);
					return ddl_nullptr;
				}

				if (ddl_nullptr != prop && *in != Grammar::CommaSeparator[0]) {
					if (ddl_nullptr == first) {
						first = std::move(prop);
					}
					if (ddl_nullptr != prev) {
						prev->m_next = prop.release();
					}
					prev = std::move(prop);
				}
			}
			++in;
		}

		// set the properties
		if (first && ddl_nullptr != node) {
			node->setProperties(first.release());
		}
    }

    return in;
}